

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CompactReporter::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  MessageInfo *pMVar2;
  ostream *poVar3;
  pointer pMVar4;
  undefined1 local_80 [8];
  Colour colourGuard_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long *local_58;
  long local_50;
  long local_48 [2];
  undefined1 local_31;
  Colour colourGuard;
  
  pMVar1 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar4 = (this->itMessage)._M_current;
  if (pMVar4 != pMVar1) {
    local_31 = 0;
    Colour::use(colour);
    poVar3 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," with ",6);
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"message","");
    local_80 = (undefined1  [8])(((long)pMVar1 - (long)pMVar4 >> 3) * -0x1111111111111111);
    _colourGuard_1 = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&colourGuard_1,local_58,local_50 + (long)local_58);
    operator<<(poVar3,(pluralise *)local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_colourGuard_1 != &local_68) {
      operator_delete(_colourGuard_1,local_68._M_allocated_capacity + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    Colour::use(None);
    pMVar4 = (this->itMessage)._M_current;
    while (pMVar4 != pMVar1) {
      if ((this->printInfoMessages != false) || (pMVar4->type != Info)) {
        poVar3 = this->stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," \'",2);
        pMVar2 = (this->itMessage)._M_current;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(pMVar2->message)._M_dataplus._M_p,
                            (pMVar2->message)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
        pMVar4 = (this->itMessage)._M_current + 1;
        (this->itMessage)._M_current = pMVar4;
        if (pMVar4 != pMVar1) {
          local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffffffffff00);
          Colour::use(FileName);
          std::__ostream_insert<char,std::char_traits<char>>(this->stream," and",4);
          Colour::use(None);
        }
      }
      pMVar4 = (this->itMessage)._M_current;
    }
  }
  return;
}

Assistant:

void printRemainingMessages( Colour::Code colour = dimColour() ) {
                if ( itMessage == messages.end() )
                    return;

                // using messages.end() directly yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>( std::distance( itMessage, itEnd ) );

                {
                    Colour colourGuard( colour );
                    stream << " with " << pluralise( N, "message" ) << ":";
                }

                for(; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if( printInfoMessages || itMessage->type != ResultWas::Info ) {
                        stream << " '" << itMessage->message << "'";
                        if ( ++itMessage != itEnd ) {
                            Colour colourGuard( dimColour() );
                            stream << " and";
                        }
                    }
                }
            }